

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cpp
# Opt level: O3

LogStream * __thiscall LogStream::operator<<(LogStream *this,double v)

{
  char **ppcVar1;
  char *__s;
  int iVar2;
  
  ppcVar1 = &(this->buffer_).cur_;
  __s = (this->buffer_).cur_;
  if (0x1f < (int)ppcVar1 - (int)__s) {
    iVar2 = snprintf(__s,0x20,"%.12g");
    *ppcVar1 = *ppcVar1 + iVar2;
  }
  return this;
}

Assistant:

LogStream& LogStream::operator<<(double v) {
    if (buffer_.avail() >= kMaxNumericSize) {
        int len = snprintf(buffer_.current(), kMaxNumericSize, "%.12g", v);
        buffer_.add(len);
    }
    return *this;
}